

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositedBupOutputter.cpp
# Opt level: O2

void __thiscall
CompositedBupOutputter::setBase(CompositedBupOutputter *this,path *basePath,Image *img,string *name)

{
  std::filesystem::__cxx11::path::operator=(&this->basePath,basePath);
  Image::operator=(&this->base,img);
  std::__cxx11::string::operator=((string *)&this->baseName,(string *)name);
  std::__cxx11::string::assign((char *)&this->withFaceName);
  std::__cxx11::string::assign((char *)&this->withMouthName);
  return;
}

Assistant:

void setBase(fs::path basePath, Image img, std::string name) override {
		this->basePath = std::move(basePath);
		base = std::move(img);
		baseName = std::move(name);
		withFaceName = "";
		withMouthName = "";
	}